

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgramOptions.cpp
# Opt level: O2

void ProgramOptions::getCharsFromFile
               (string *fileName,
               set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *result)

{
  runtime_error *this;
  uint32_t local_24c;
  iterator it;
  string str;
  ifstream fs;
  byte abStack_200 [200];
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream(&fs,(string *)fileName,_S_bin);
  if ((abStack_200[*(long *)(_fs + -0x18)] & 5) == 0) {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&str,*(undefined8 *)((long)auStack_138 + *(long *)(_fs + -0x18)),
               0xffffffffffffffff,0,0xffffffff);
    it._M_current = str._M_dataplus._M_p;
    while (it._M_current != str._M_dataplus._M_p + str._M_string_length) {
      local_24c = utf8::next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                            (&it,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(str._M_dataplus._M_p + str._M_string_length));
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_insert_unique<unsigned_int>(&result->_M_t,&local_24c);
    }
    std::__cxx11::string::~string((string *)&str);
    std::ifstream::~ifstream(&fs);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"can\'t open characters file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ProgramOptions::getCharsFromFile(const std::string& fileName, std::set<std::uint32_t>& result)
{
    std::ifstream fs(fileName, std::ifstream::binary);
    if (!fs)
        throw std::runtime_error("can't open characters file");
    std::string str((std::istreambuf_iterator<char>(fs)),
                    std::istreambuf_iterator<char>());

    for (auto it = str.begin(); it != str.end();)
        result.insert(utf8::next(it, str.end()));
}